

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

void testing::internal::TuplePrefix<1ul>::
     ExplainMatchFailuresTo<std::tuple<testing::Matcher<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>>,std::tuple<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>>
               (tuple<testing::Matcher<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
                *matchers,tuple<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> *values,
               ostream *os)

{
  BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> BVar1;
  MatcherInterface<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> *pMVar2;
  int iVar3;
  ostream *poVar4;
  Value value;
  type matcher;
  StringMatchResultListener listener;
  _Head_base<0UL,_mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_false> local_1f0;
  MatcherBase<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> local_1e8;
  string local_1d0;
  StringMatchResultListener local_1b0;
  
  Matcher<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>::Matcher
            ((Matcher<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> *)&local_1e8,
             (Matcher<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> *)matchers);
  BVar1.super_ExprBase.impl_ =
       (ExprBase)
       (values->super__Tuple_impl<0UL,_mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>).
       super__Head_base<0UL,_mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_false>.
       _M_head_impl.super_ExprBase.impl_;
  local_1f0._M_head_impl.super_ExprBase.impl_ =
       (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)
       (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)BVar1.super_ExprBase.impl_;
  StringMatchResultListener::StringMatchResultListener(&local_1b0);
  iVar3 = (*((local_1e8.impl_.value_)->super_MatcherDescriberInterface).
            _vptr_MatcherDescriberInterface[4])
                    (local_1e8.impl_.value_,BVar1.super_ExprBase.impl_,&local_1b0);
  if ((char)iVar3 == '\0') {
    poVar4 = std::operator<<(os,"  Expected arg #");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::operator<<(poVar4,": ");
    pMVar2 = (matchers->
             super__Tuple_impl<0UL,_testing::Matcher<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
             ).
             super__Head_base<0UL,_testing::Matcher<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>,_false>
             ._M_head_impl.super_MatcherBase<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>
             .impl_.value_;
    (*(pMVar2->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[2])(pMVar2,os);
    std::operator<<(os,"\n           Actual: ");
    internal2::
    TypeWithoutFormatter<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(testing::internal2::TypeKind)2>
    ::PrintValue(&local_1f0._M_head_impl,os);
    std::__cxx11::stringbuf::str();
    PrintIfNotEmpty(&local_1d0,os);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::operator<<(os,"\n");
  }
  StringMatchResultListener::~StringMatchResultListener(&local_1b0);
  MatcherBase<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>::~MatcherBase(&local_1e8);
  return;
}

Assistant:

static void ExplainMatchFailuresTo(const MatcherTuple& matchers,
                                     const ValueTuple& values,
                                     ::std::ostream* os) {
    using ::std::tr1::tuple_element;
    using ::std::tr1::get;

    // First, describes failures in the first N - 1 fields.
    TuplePrefix<N - 1>::ExplainMatchFailuresTo(matchers, values, os);

    // Then describes the failure (if any) in the (N - 1)-th (0-based)
    // field.
    typename tuple_element<N - 1, MatcherTuple>::type matcher =
        get<N - 1>(matchers);
    typedef typename tuple_element<N - 1, ValueTuple>::type Value;
    Value value = get<N - 1>(values);
    StringMatchResultListener listener;
    if (!matcher.MatchAndExplain(value, &listener)) {
      // TODO(wan): include in the message the name of the parameter
      // as used in MOCK_METHOD*() when possible.
      *os << "  Expected arg #" << N - 1 << ": ";
      get<N - 1>(matchers).DescribeTo(os);
      *os << "\n           Actual: ";
      // We remove the reference in type Value to prevent the
      // universal printer from printing the address of value, which
      // isn't interesting to the user most of the time.  The
      // matcher's MatchAndExplain() method handles the case when
      // the address is interesting.
      internal::UniversalPrint(value, os);
      PrintIfNotEmpty(listener.str(), os);
      *os << "\n";
    }
  }